

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.cpp
# Opt level: O3

void __thiscall
TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
          (ParticleSwarmState *this,double *box_lower,double *box_upper,
          function<double_()> *get_random01)

{
  double *box_upper_00;
  function<double_()> *__x;
  uint uVar1;
  ulong uVar2;
  long *extraout_RDX;
  double *pdVar3;
  ParticleSwarmState *this_00;
  ulong uVar4;
  double dVar5;
  double dVar6;
  string sStack_118;
  string sStack_f8;
  string sStack_d8;
  string sStack_b8;
  _Any_data _Stack_98;
  code *pcStack_88;
  function<double_()> *pfStack_78;
  double *pdStack_70;
  ulong uStack_68;
  double *pdStack_60;
  ParticleSwarmState *pPStack_58;
  
  __x = (function<double_()> *)(ulong)(uint)this->num_dimensions;
  if (0 < this->num_particles * this->num_dimensions) {
    uVar4 = 0;
    pdVar3 = box_lower;
    this_00 = this;
    do {
      uVar1 = (int)uVar4 >> 0x1f;
      uVar2 = (long)((ulong)uVar1 << 0x20 | uVar4 & 0xffffffff) % (long)(int)__x & 0xffffffff;
      if ((get_random01->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00113a23:
        std::__throw_bad_function_call();
        sStack_b8._M_dataplus._M_p = (pointer)&sStack_b8.field_2;
        pfStack_78 = get_random01;
        pdStack_70 = box_lower;
        uStack_68 = uVar4;
        pdStack_60 = box_upper;
        pPStack_58 = this;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sStack_b8,"ParticleSwarmState::initializeParticlesInsideBox","");
        sStack_f8._M_dataplus._M_p = (pointer)&sStack_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_f8,"box lower bounds","");
        checkVarSize(&sStack_b8,&sStack_f8,(int)((ulong)((long)pdVar3[1] - (long)*pdVar3) >> 3),
                     this_00->num_dimensions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_f8._M_dataplus._M_p != &sStack_f8.field_2) {
          operator_delete(sStack_f8._M_dataplus._M_p,sStack_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_b8._M_dataplus._M_p != &sStack_b8.field_2) {
          operator_delete(sStack_b8._M_dataplus._M_p,sStack_b8.field_2._M_allocated_capacity + 1);
        }
        sStack_d8._M_dataplus._M_p = (pointer)&sStack_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sStack_d8,"ParticleSwarmState::initializeParticlesInsideBox","");
        sStack_118._M_dataplus._M_p = (pointer)&sStack_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_118,"box upper bounds","")
        ;
        checkVarSize(&sStack_d8,&sStack_118,(int)((ulong)(extraout_RDX[1] - *extraout_RDX) >> 3),
                     this_00->num_dimensions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_118._M_dataplus._M_p != &sStack_118.field_2) {
          operator_delete(sStack_118._M_dataplus._M_p,sStack_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_d8._M_dataplus._M_p != &sStack_d8.field_2) {
          operator_delete(sStack_d8._M_dataplus._M_p,sStack_d8.field_2._M_allocated_capacity + 1);
        }
        pdVar3 = (double *)*pdVar3;
        box_upper_00 = (double *)*extraout_RDX;
        std::function<double_()>::function((function<double_()> *)&_Stack_98,__x);
        initializeParticlesInsideBox(this_00,pdVar3,box_upper_00,(function<double_()> *)&_Stack_98);
        if (pcStack_88 != (code *)0x0) {
          (*pcStack_88)(&_Stack_98,&_Stack_98,__destroy_functor);
        }
        return;
      }
      dVar5 = ABS(box_upper[uVar2] - box_lower[uVar2]);
      this_00 = (ParticleSwarmState *)get_random01;
      dVar6 = (*get_random01->_M_invoker)((_Any_data *)get_random01);
      (this->particle_positions).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] =
           dVar6 * dVar5 +
           box_lower[(long)((ulong)uVar1 << 0x20 | uVar4 & 0xffffffff) % (long)this->num_dimensions
                     & 0xffffffff];
      if ((get_random01->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00113a23;
      this_00 = (ParticleSwarmState *)get_random01;
      dVar6 = (*get_random01->_M_invoker)((_Any_data *)get_random01);
      (this->particle_velocities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = dVar6 * (dVar5 + dVar5) - dVar5;
      uVar4 = uVar4 + 1;
      __x = (function<double_()> *)(long)this->num_dimensions;
    } while ((long)uVar4 < (long)this->num_particles * (long)__x);
  }
  this->positions_initialized = true;
  this->velocities_initialized = true;
  return;
}

Assistant:

void ParticleSwarmState::initializeParticlesInsideBox(const double box_lower[], const double box_upper[],
                                                      const std::function<double(void)> get_random01) {
    for (int i=0; i<num_particles * num_dimensions; i++) {
        double range = std::fabs(box_upper[i % num_dimensions] - box_lower[i % num_dimensions]);
        particle_positions[i] = range * get_random01() + box_lower[i % num_dimensions];
        particle_velocities[i] = 2 * range * get_random01() - range;
    }
    positions_initialized = true;
    velocities_initialized = true;
}